

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem-C-API.cpp
# Opt level: O1

llb_buildsystem_command_t *
llb_buildsystem_external_command_create
          (llb_data_t *name,llb_buildsystem_external_command_delegate_t delegate)

{
  uint64_t uVar1;
  uint8_t *puVar2;
  llb_buildsystem_command_t *plVar3;
  long lVar4;
  llb_buildsystem_external_command_delegate_t *plVar5;
  llb_buildsystem_command_t *plVar6;
  byte bVar7;
  
  bVar7 = 0;
  if (delegate.start ==
      (_func_void_void_ptr_llb_buildsystem_command_t_ptr_llb_buildsystem_interface_t_ptr_llb_task_interface_t
       *)0x0) {
    __assert_fail("delegate.start",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/products/libllbuild/BuildSystem-C-API.cpp"
                  ,0x52e,
                  "llb_buildsystem_command_t *llb_buildsystem_external_command_create(const llb_data_t *, llb_buildsystem_external_command_delegate_t)"
                 );
  }
  if (delegate.provide_value !=
      (_func_void_void_ptr_llb_buildsystem_command_t_ptr_llb_buildsystem_interface_t_ptr_llb_task_interface_t_llb_build_value_ptr_uintptr_t
       *)0x0) {
    if (delegate.execute_command_detached !=
        (_func_void_void_ptr_llb_buildsystem_command_t_ptr_llb_buildsystem_interface_t_ptr_llb_task_interface_t_llb_buildsystem_queue_job_context_t_ptr_void_ptr__func_void_void_ptr_llb_buildsystem_command_result_t_llb_build_value_ptr_ptr
         *)0x0 || delegate.execute_command !=
                  (_func_llb_buildsystem_command_result_t_void_ptr_llb_buildsystem_command_t_ptr_llb_buildsystem_interface_t_ptr_llb_task_interface_t_llb_buildsystem_queue_job_context_t_ptr
                   *)0x0) {
      plVar3 = (llb_buildsystem_command_t *)operator_new(0x238);
      uVar1 = name->length;
      puVar2 = name->data;
      *(undefined ***)plVar3 = &PTR__Command_002425e0;
      *(llb_buildsystem_command_t **)(plVar3 + 8) = plVar3 + 0x18;
      if (puVar2 == (uint8_t *)0x0) {
        *(undefined8 *)(plVar3 + 0x10) = 0;
        plVar3[0x18] = (llb_buildsystem_command_t)0x0;
      }
      else {
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)(plVar3 + 8),puVar2,puVar2 + uVar1);
      }
      *(undefined8 *)(plVar3 + 0x48) = 0;
      *(undefined8 *)(plVar3 + 0x50) = 0;
      *(undefined8 *)(plVar3 + 0x38) = 0;
      *(undefined8 *)(plVar3 + 0x40) = 0;
      *(undefined8 *)(plVar3 + 0x28) = 0;
      *(undefined8 *)(plVar3 + 0x30) = 0;
      plVar3[0x58] = (llb_buildsystem_command_t)0x0;
      *(llb_buildsystem_command_t **)(plVar3 + 0x60) = plVar3 + 0x70;
      *(undefined8 *)(plVar3 + 0x68) = 0;
      plVar3[0x70] = (llb_buildsystem_command_t)0x0;
      *(undefined2 *)(plVar3 + 0x80) = 0;
      plVar3[0x82] = (llb_buildsystem_command_t)0x0;
      plVar3[0xf8] = (llb_buildsystem_command_t)0x0;
      *(llb_buildsystem_command_t **)(plVar3 + 0x100) = plVar3 + 0x110;
      *(undefined8 *)(plVar3 + 0x108) = 0x100000000;
      *(undefined2 *)(plVar3 + 0x130) = 1;
      *(undefined ***)plVar3 = &PTR__CAPIExternalCommand_00242090;
      plVar5 = &delegate;
      plVar6 = plVar3 + 0x138;
      for (lVar4 = 0xc; lVar4 != 0; lVar4 = lVar4 + -1) {
        *(void **)plVar6 = plVar5->context;
        plVar5 = (llb_buildsystem_external_command_delegate_t *)
                 ((long)plVar5 + (ulong)bVar7 * -0x10 + 8);
        plVar6 = plVar6 + (ulong)bVar7 * -0x10 + 8;
      }
      *(llb_buildsystem_command_t **)(plVar3 + 0x198) = plVar3 + 0x1a8;
      *(undefined8 *)(plVar3 + 0x1a0) = 0x100000000;
      *(llb_buildsystem_command_t **)(plVar3 + 0x1c8) = plVar3 + 0x1d8;
      *(undefined8 *)(plVar3 + 0x1d0) = 0x100000000;
      *(llb_buildsystem_command_t **)(plVar3 + 0x1f8) = plVar3 + 0x208;
      *(undefined8 *)(plVar3 + 0x200) = 0;
      plVar3[0x208] = (llb_buildsystem_command_t)0x0;
      *(undefined4 *)(plVar3 + 0x218) = 2;
      *(undefined8 *)(plVar3 + 0x220) = 0;
      plVar3[0x228] = (llb_buildsystem_command_t)0x0;
      *(undefined8 *)(plVar3 + 0x230) = 0;
      if (*(code **)(plVar3 + 0x140) != (code *)0x0) {
        (**(code **)(plVar3 + 0x140))
                  (*(undefined8 *)(plVar3 + 0x138),plVar3,
                   anon_unknown.dwarf_287390::CAPIExternalCommand::CAPIExternalCommand::
                   anon_class_1_0_00000001::__invoke,
                   anon_unknown.dwarf_287390::CAPIExternalCommand::CAPIExternalCommand::
                   anon_class_1_0_00000001::__invoke,
                   anon_unknown.dwarf_287390::CAPIExternalCommand::CAPIExternalCommand::
                   anon_class_1_0_00000001::__invoke);
      }
      return plVar3;
    }
    __assert_fail("delegate.execute_command || delegate.execute_command_detached",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/products/libllbuild/BuildSystem-C-API.cpp"
                  ,0x530,
                  "llb_buildsystem_command_t *llb_buildsystem_external_command_create(const llb_data_t *, llb_buildsystem_external_command_delegate_t)"
                 );
  }
  __assert_fail("delegate.provide_value",
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/products/libllbuild/BuildSystem-C-API.cpp"
                ,0x52f,
                "llb_buildsystem_command_t *llb_buildsystem_external_command_create(const llb_data_t *, llb_buildsystem_external_command_delegate_t)"
               );
}

Assistant:

llb_buildsystem_command_t*
llb_buildsystem_external_command_create(
    const llb_data_t* name,
    llb_buildsystem_external_command_delegate_t delegate) {
  // Check that all required methods are provided.
  assert(delegate.start);
  assert(delegate.provide_value);
  assert(delegate.execute_command || delegate.execute_command_detached);
  
  return (llb_buildsystem_command_t*) new CAPIExternalCommand(
      StringRef((const char*)name->data, name->length), delegate);
}